

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::FindHelper<false,true>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Var pvVar7;
  Var pvVar8;
  Var pvVar9;
  undefined4 *puVar10;
  undefined4 extraout_var;
  JavascriptMethod p_Var11;
  char16_t *varName;
  uint uVar12;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_48;
  Var element;
  RecyclableObject *local_38;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  element = (Var)length;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00a631cd:
    varName = L"[TypedArray].prototype.find";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.find";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) goto LAB_00a631cd;
  pvVar7 = Arguments::operator[](args,1);
  local_38 = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar4) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  else {
    local_48 = (RecyclableObject *)0x0;
    if (pArr != (JavascriptArray *)0x0) {
      pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      pvVar7 = element;
      if (0xffffffff < (long)element) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
        if (!bVar4) goto LAB_00a631ef;
        *puVar10 = 0;
        pvVar7 = element;
      }
      do {
        pvVar8 = pvVar7;
        uVar12 = (int)pvVar8 - 1;
        pvVar7 = (Var)(ulong)uVar12;
        if ((long)element <= (long)pvVar7) goto LAB_00a630f0;
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        local_48 = pRVar1;
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                  (pArr,pvVar7,&local_48);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        pvVar9 = JavascriptNumber::ToVar(uVar12,scriptContext);
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = scriptContext->threadContext;
        bVar4 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
        p_Var11 = RecyclableObject::GetEntryPoint(local_38);
        CheckIsExecutable(local_38,p_Var11);
        p_Var11 = RecyclableObject::GetEntryPoint(local_38);
        pvVar9 = (*p_Var11)(local_38,(CallInfo)local_38,0x2000004,0,0,0,0,0x2000004,
                            jsReentLock._24_8_,local_48,pvVar9,pArr);
        pTVar2->reentrancySafeOrHandled = bVar4;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        BVar6 = JavascriptConversion::ToBoolean(pvVar9,scriptContext);
        if (BVar6 != 0) goto LAB_00a631b1;
        bVar4 = IsNonES5Array(obj);
      } while (bVar4);
      bVar4 = VarIsImpl<Js::ES5Array>(obj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2141,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) goto LAB_00a631ef;
        *puVar10 = 0;
      }
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_48 = (RecyclableObject *)
                 FindObjectHelper<false,true>
                           (obj,(int64)element,(ulong)pvVar8 & 0xffffffff,local_38,
                            (Var)jsReentLock._24_8_,scriptContext);
      goto LAB_00a631b1;
    }
  }
  local_48 = (RecyclableObject *)0x0;
  uVar12 = (int)element - 1;
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_48 = (RecyclableObject *)
               FindObjectHelper<false,true>
                         (obj,(int64)element,0,local_38,(Var)jsReentLock._24_8_,scriptContext);
  }
  else {
    if (0xffffffff < (long)element) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) {
LAB_00a631ef:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    do {
      if ((long)element <= (long)(ulong)uVar12) goto LAB_00a630f0;
      iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)uVar12);
      local_48 = (RecyclableObject *)CONCAT44(extraout_var,iVar5);
      pvVar7 = JavascriptNumber::ToVar(uVar12,scriptContext);
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pTVar2 = scriptContext->threadContext;
      bVar4 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var11 = RecyclableObject::GetEntryPoint(local_38);
      CheckIsExecutable(local_38,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint(local_38);
      pvVar7 = (*p_Var11)(local_38,(CallInfo)local_38,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_
                          ,local_48,pvVar7,typedArrayBase);
      pTVar2->reentrancySafeOrHandled = bVar4;
      JsReentLock::MutateArrayObject((JsReentLock *)local_78);
      *(bool *)((long)local_78 + 0x108) = true;
      BVar6 = JavascriptConversion::ToBoolean(pvVar7,scriptContext);
      uVar12 = uVar12 - 1;
    } while (BVar6 == 0);
  }
  goto LAB_00a631b1;
LAB_00a630f0:
  local_48 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
LAB_00a631b1:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_48;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }